

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

int Gia_ObjFanin1CopyRepr(Gia_Man_t *p,Gia_Obj_t *pObj,int *pReprs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pObj_00;
  int fanId;
  int *pReprs_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjFaninId1p(p,pObj);
  if (pReprs[iVar1] == -1) {
    p_local._4_4_ = Gia_ObjFanin1Copy(pObj);
  }
  else {
    iVar2 = Abc_Lit2Var(pReprs[iVar1]);
    iVar3 = Gia_ObjId(p,pObj);
    if (iVar3 <= iVar2) {
      __assert_fail("Abc_Lit2Var(pReprs[fanId]) < Gia_ObjId(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSweep.c"
                    ,0x157,"int Gia_ObjFanin1CopyRepr(Gia_Man_t *, Gia_Obj_t *, int *)");
    }
    iVar2 = Abc_Lit2Var(pReprs[iVar1]);
    pObj_00 = Gia_ManObj(p,iVar2);
    iVar2 = Gia_ObjValue(pObj_00);
    uVar4 = Gia_ObjFaninC1(pObj);
    uVar5 = Abc_LitIsCompl(pReprs[iVar1]);
    p_local._4_4_ = Abc_LitNotCond(iVar2,uVar4 ^ uVar5);
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ObjFanin1CopyRepr( Gia_Man_t * p, Gia_Obj_t * pObj, int * pReprs )
{
    int fanId = Gia_ObjFaninId1p( p, pObj );
    if ( pReprs[fanId] == -1 )
        return Gia_ObjFanin1Copy( pObj );
    assert( Abc_Lit2Var(pReprs[fanId]) < Gia_ObjId(p, pObj) );
    return Abc_LitNotCond( Gia_ObjValue(Gia_ManObj(p, Abc_Lit2Var(pReprs[fanId]))), Gia_ObjFaninC1(pObj) ^ Abc_LitIsCompl(pReprs[fanId]) );
}